

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void substSelect(sqlite3 *db,Select *p,int iTable,ExprList *pEList)

{
  SrcList *pSVar1;
  Expr *pEVar2;
  int iVar3;
  Select **ppSVar4;
  
  if (p != (Select *)0x0) {
    substExprList(db,p->pEList,iTable,pEList);
    substExprList(db,p->pGroupBy,iTable,pEList);
    substExprList(db,p->pOrderBy,iTable,pEList);
    pEVar2 = substExpr(db,p->pHaving,iTable,pEList);
    p->pHaving = pEVar2;
    pEVar2 = substExpr(db,p->pWhere,iTable,pEList);
    p->pWhere = pEVar2;
    substSelect(db,p->pPrior,iTable,pEList);
    pSVar1 = p->pSrc;
    if ((pSVar1 != (SrcList *)0x0) && (0 < pSVar1->nSrc)) {
      iVar3 = pSVar1->nSrc + 1;
      ppSVar4 = &pSVar1->a[0].pSelect;
      do {
        substSelect(db,*ppSVar4,iTable,pEList);
        iVar3 = iVar3 + -1;
        ppSVar4 = ppSVar4 + 0xd;
      } while (1 < iVar3);
    }
  }
  return;
}

Assistant:

static void substSelect(
  sqlite3 *db,         /* Report malloc errors here */
  Select *p,           /* SELECT statement in which to make substitutions */
  int iTable,          /* Table to be replaced */
  ExprList *pEList     /* Substitute values */
){
  SrcList *pSrc;
  struct SrcList_item *pItem;
  int i;
  if( !p ) return;
  substExprList(db, p->pEList, iTable, pEList);
  substExprList(db, p->pGroupBy, iTable, pEList);
  substExprList(db, p->pOrderBy, iTable, pEList);
  p->pHaving = substExpr(db, p->pHaving, iTable, pEList);
  p->pWhere = substExpr(db, p->pWhere, iTable, pEList);
  substSelect(db, p->pPrior, iTable, pEList);
  pSrc = p->pSrc;
  assert( pSrc );  /* Even for (SELECT 1) we have: pSrc!=0 but pSrc->nSrc==0 */
  if( ALWAYS(pSrc) ){
    for(i=pSrc->nSrc, pItem=pSrc->a; i>0; i--, pItem++){
      substSelect(db, pItem->pSelect, iTable, pEList);
    }
  }
}